

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O2

void __thiscall
tonk::ReceiverBandwidthControl::UpdateSendShape
          (ReceiverBandwidthControl *this,uint64_t nowUsec,uint smoothedSendDelayUsec)

{
  float fVar1;
  Decision DVar2;
  
  if (smoothedSendDelayUsec == 0) {
    smoothedSendDelayUsec = (this->Bandwidth).Measurement.SmoothedMaxTripUsec;
  }
  DVar2 = UpdateCC(this,nowUsec,smoothedSendDelayUsec);
  if ((this->NextShape).AppBPS < 1000) {
    (this->NextShape).AppBPS = 1000;
  }
  fVar1 = (this->Bandwidth).Measurement.SmoothedPLR;
  (this->NextShape).FECRate = fVar1 + fVar1;
  if (DVar2 == PushUpdateInAck) {
    this->ShouldAckFast = true;
  }
  return;
}

Assistant:

void ReceiverBandwidthControl::UpdateSendShape(
    uint64_t nowUsec,
    unsigned smoothedSendDelayUsec)
{
    // If delay feedback has not been received, use our own estimate
    if (smoothedSendDelayUsec <= 0) {
        smoothedSendDelayUsec = Bandwidth.Measurement.SmoothedMaxTripUsec;
    }

    // Update CC
    const Decision decision = UpdateCC(nowUsec, smoothedSendDelayUsec);

    // Minimum BPS
    if (NextShape.AppBPS < protocol::kMinimumBytesPerSecond) {
        NextShape.AppBPS = protocol::kMinimumBytesPerSecond;
    }

    // Send FEC datagrams proportional to the loss rate
    NextShape.FECRate = Bandwidth.Measurement.SmoothedPLR * 2.f;

    if (decision == Decision::PushUpdateInAck) {
        // Ask connection timer tick to send an ACK with our new bandwidth shape
        ShouldAckFast = true;
    }
}